

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  size_t __new_size;
  size_t s;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> local_60;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  __new_size = s;
  Direction::Direction((Direction *)&local_60);
  std::vector<diy::Direction,_std::allocator<diy::Direction>_>::resize
            (v,__new_size,(value_type *)&local_60);
  itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::~small_vector(&local_60);
  if (s != 0) {
    load<diy::Direction>
              (bb,(v->super__Vector_base<diy::Direction,_std::allocator<diy::Direction>_>)._M_impl.
                  super__Vector_impl_data._M_start,s);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }